

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O0

Var Js::GlobalObject::EntryEvalHelper
              (ScriptContext *scriptContext,RecyclableObject *function,Arguments *args)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  JavascriptLibrary *library;
  Var pvVar4;
  BOOL isIndirect;
  BOOL strictMode;
  ModuleID moduleID;
  FrameDisplay *environment;
  Arguments *args_local;
  RecyclableObject *function_local;
  ScriptContext *scriptContext_local;
  
  _strictMode = (FrameDisplay *)&NullFrameDisplay;
  bVar2 = false;
  bVar3 = 0;
  bVar1 = Arguments::IsDirectEvalCall(args);
  if (bVar1) {
    if (((ulong)args->Info & 0xffffff) != 0) {
      _strictMode = Arguments::GetFrameDisplay(args);
      bVar2 = FrameDisplay::GetStrictMode(_strictMode);
    }
  }
  else {
    bVar1 = Phases::IsEnabled((Phases *)&DAT_01eafdf0,FastIndirectEvalPhase);
    bVar3 = (bVar1 ^ 0xffU) & 1;
  }
  library = RecyclableObject::GetLibrary(function);
  pvVar4 = VEval(library,_strictMode,0,bVar2 != false,bVar3 != 0,args,false,true,0,
                 (ScriptContext *)0x0);
  return pvVar4;
}

Assistant:

Var GlobalObject::EntryEvalHelper(ScriptContext* scriptContext, RecyclableObject* function, Js::Arguments& args)
    {
        FrameDisplay* environment = (FrameDisplay*)&NullFrameDisplay;
        ModuleID moduleID = kmodGlobal;
        BOOL strictMode = FALSE;
        // TODO: Handle call from global scope, strict mode
        BOOL isIndirect = FALSE;

        if (args.IsDirectEvalCall())
        {
            // This was recognized as an eval call at compile time. The last one or two args are internal to us.
            // Argcount will be one of the following when called from global code
            //  - eval("...")     : argcount 3 : this, evalString, frameDisplay
            //  - eval.call("..."): argcount 2 : this(which is string) , frameDisplay
            if (args.Info.Count >= 1)
            {
                environment = args.GetFrameDisplay();
                strictMode = environment->GetStrictMode();
            }
        }
        else
        {
            // This must be an indirect "eval" call that we didn't detect at compile time.
            // Pass null as the environment, which will force all lookups in the eval code
            // to use the root for the current module.
            // Also pass "null" for "this", which will force the callee to use the current module root.
            isIndirect = !PHASE_OFF1(Js::FastIndirectEvalPhase);
        }

        return GlobalObject::VEval(function->GetLibrary(), environment, moduleID, !!strictMode, !!isIndirect, args,
            /* isLibraryCode = */ false, /* registerDocument */ true, /*additionalGrfscr */ 0);
    }